

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O3

Dictionary * ASDCP::DefaultSMPTEDict(void)

{
  if (s_SMPTEDictInit == '\0') {
    pthread_mutex_lock((pthread_mutex_t *)&s_SMPTEDictLock);
    if (s_SMPTEDictInit == '\0') {
      Dictionary::Init(&s_SMPTEDict);
      Dictionary::DeleteEntry(&s_SMPTEDict,1);
      Dictionary::DeleteEntry(&s_SMPTEDict,0xe);
      Dictionary::DeleteEntry(&s_SMPTEDict,0x110);
      s_SMPTEDictInit = '\x01';
    }
    pthread_mutex_unlock((pthread_mutex_t *)&s_SMPTEDictLock);
  }
  return &s_SMPTEDict;
}

Assistant:

const ASDCP::Dictionary&
ASDCP::DefaultSMPTEDict()
{
  if ( ! s_SMPTEDictInit )
    {
      Kumu::AutoMutex AL(s_SMPTEDictLock);

      if ( ! s_SMPTEDictInit )
	{
	  s_SMPTEDict.Init();

	  s_SMPTEDict.DeleteEntry(MDD_MXFInterop_OPAtom);
	  s_SMPTEDict.DeleteEntry(MDD_MXFInterop_CryptEssence);
	  s_SMPTEDict.DeleteEntry(MDD_MXFInterop_GenericDescriptor_SubDescriptors);

	  s_SMPTEDictInit = true;
	}
    }

  return s_SMPTEDict;
}